

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

uint32_t NgramBuilder_add_ngram
                   (NgramBuilder builder,uint32_t *wids,uint32_t order,uint32_t prob,uint32_t bow)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uStack_420;
  undefined1 local_418 [5];
  undefined1 auStack_413 [3];
  char encode_buff [1024];
  
  if (0x3e < order) {
    uStack_420 = (code *)0x10379a;
    __assert_fail("order < (1<<6) -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                  ,0x17e,
                  "size_t _encode_gram(const uint32_t *, uint32_t, uint32_t, uint32_t, char *)");
  }
  local_418[0] = (bow != 0) << 6 | (byte)order | 0x80;
  lVar2 = 5;
  for (lVar4 = -9; (ulong)order * 4 + lVar4 != -9; lVar4 = lVar4 + -4) {
    *(undefined4 *)((long)&uStack_420 + lVar2 + 4) = *(undefined4 *)((long)wids + lVar2 + -5);
    lVar2 = lVar2 + 4;
  }
  *(uint32_t *)((long)&uStack_420 + lVar2 + 4) = prob;
  if (bow != 0) {
    *(uint32_t *)(local_418 + lVar2) = bow;
    lVar2 = -lVar4;
  }
  if ((uint)lVar2 < 0x401) {
    builder->added_gram_nums[order - 1] = builder->added_gram_nums[order - 1] + 1;
    uStack_420 = (code *)0x10375b;
    pcVar3 = _NgramBuilder_cp_str(builder,local_418,(ulong)((uint)lVar2 & 0x7ff));
    sVar1 = builder->added_total_gram_num;
    builder->added_total_gram_num = sVar1 + 1;
    builder->ngram_offsets[sVar1] = pcVar3;
    return 0;
  }
  uStack_420 = ngram_sort_cmp;
  __assert_fail("len <= 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x1cc,
                "uint32_t NgramBuilder_add_ngram(NgramBuilder, const uint32_t *, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

uint32_t NgramBuilder_add_ngram(NgramBuilder builder, const uint32_t* wids, uint32_t order, uint32_t prob, uint32_t bow){
    char encode_buff[1024];//actually is 3 + order*4
    uint32_t len = _encode_gram(wids, order, prob, bow, encode_buff);
    
    assert(len <= 1024);
    builder->added_gram_nums[order-1]++;
    builder->ngram_offsets[builder->added_total_gram_num++] = _NgramBuilder_cp_str(builder, encode_buff, len);
    return 0; 
}